

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall t_rb_generator::generate_service(t_rb_generator *this,t_service *tservice)

{
  t_rb_ofstream *out;
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  t_program *this_00;
  long lVar5;
  size_type sVar6;
  int iVar7;
  long *plVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type *psVar10;
  t_rb_generator *ptVar11;
  undefined8 uVar12;
  string f_service_name;
  string local_1a0;
  string local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  t_rb_generator *local_140;
  long local_138;
  undefined1 local_130 [16];
  string local_120;
  string local_100;
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  string local_50;
  
  pcVar4 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  t_generator::underscore(&local_180,(t_generator *)this,&local_50);
  plVar8 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_180,0,(char *)0x0,
                              (ulong)(this->namespace_dir_)._M_dataplus._M_p);
  paVar2 = &local_1a0.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1a0.field_2._M_allocated_capacity = *psVar10;
    local_1a0.field_2._8_8_ = plVar8[3];
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar10;
    local_1a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_140 = (t_rb_generator *)local_130;
  ptVar11 = (t_rb_generator *)(plVar8 + 2);
  if ((t_rb_generator *)*plVar8 == ptVar11) {
    local_130._0_8_ = (ptVar11->super_t_oop_generator).super_t_generator._vptr_t_generator;
    local_130._8_8_ = plVar8[3];
  }
  else {
    local_130._0_8_ = (ptVar11->super_t_oop_generator).super_t_generator._vptr_t_generator;
    local_140 = (t_rb_generator *)*plVar8;
  }
  local_138 = plVar8[1];
  *plVar8 = (long)ptVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  paVar3 = &local_180.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar3) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  out = &this->f_service_;
  ptVar11 = local_140;
  std::ofstream::open((char *)out,(_Ios_Openmode)local_140);
  rb_autogen_comment_abi_cxx11_(&local_1a0,ptVar11);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  render_require_thrift_abi_cxx11_(&local_180,this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,local_180._M_dataplus._M_p,local_180._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar3) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if (tservice->extends_ != (t_service *)0x0) {
    if (this->namespaced_ == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"require \'",9);
      this_00 = (tservice->extends_->super_t_type).program_;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"rb","");
      t_program::get_namespace((string *)&local_70,this_00,&local_100);
      rb_namespace_to_path_prefix(&local_1a0,this,(string *)&local_70);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
      iVar7 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      lVar5 = *(long *)CONCAT44(extraout_var,iVar7);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,lVar5,((long *)CONCAT44(extraout_var,iVar7))[1] + lVar5);
      t_generator::underscore(&local_180,(t_generator *)this,&local_120);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_180._M_dataplus._M_p,local_180._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar3) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      if ((_Base_ptr)local_70._0_8_ != (_Base_ptr)local_60) {
        operator_delete((void *)local_70._0_8_);
      }
      uVar12 = local_100._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_0032ac80;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"require \'",9);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,(this->require_prefix_)._M_dataplus._M_p,
                          (this->require_prefix_)._M_string_length);
      iVar7 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      lVar5 = *(long *)CONCAT44(extraout_var_00,iVar7);
      local_90._M_allocated_capacity = (size_type)&local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,lVar5,((long *)CONCAT44(extraout_var_00,iVar7))[1] + lVar5);
      t_generator::underscore(&local_1a0,(t_generator *)this,(string *)&local_90);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      uVar12 = local_90._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_allocated_capacity == &local_80) goto LAB_0032ac80;
    }
    operator_delete((void *)uVar12);
  }
LAB_0032ac80:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"require \'",9);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,(this->require_prefix_)._M_dataplus._M_p,
                      (this->require_prefix_)._M_string_length);
  pcVar4 = (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = local_c8 + 0x28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_c8 + 0x18),pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
            );
  t_generator::underscore(&local_1a0,(t_generator *)this,(string *)(local_c8 + 0x18));
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types\'",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if (local_b0._M_dataplus._M_p != local_c8 + 0x28) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  ptVar11 = (t_rb_generator *)local_c8;
  ruby_modules_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ptVar11,this,(tservice->super_t_type).program_);
  begin_namespace(ptVar11,out,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  if (0 < *(int *)&(this->f_service_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)&(this->f_service_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"module ",7);
  iVar7 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  lVar5 = *(long *)CONCAT44(extraout_var_01,iVar7);
  local_160 = &local_150;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,lVar5,((long *)CONCAT44(extraout_var_01,iVar7))[1] + lVar5);
  paVar3 = local_160;
  iVar7 = toupper((int)local_160->_M_local_buf[0]);
  paVar3->_M_local_buf[0] = (char)iVar7;
  sVar6 = local_158;
  if (local_160 == &local_150) {
    local_1a0.field_2._8_8_ = local_150._8_8_;
    local_160 = paVar2;
  }
  local_1a0._M_string_length = local_158;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p = (pointer)local_160;
  paVar3 = local_160;
  local_160 = &local_150;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,paVar3->_M_local_buf,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  puVar1 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  generate_service_client(this,tservice);
  generate_service_server(this,tservice);
  generate_service_helpers(this,tservice);
  iVar7 = *(int *)&(this->f_service_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)&(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
           field_0xf8 = iVar7 + -1;
  if (1 < iVar7) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)&(this->f_service_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar11 = (t_rb_generator *)local_e0;
  ruby_modules_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ptVar11,this,(tservice->super_t_type).program_);
  end_namespace(ptVar11,out,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  std::ofstream::close();
  if (local_140 != (t_rb_generator *)local_130) {
    operator_delete(local_140);
  }
  return;
}

Assistant:

void t_rb_generator::generate_service(t_service* tservice) {
  string f_service_name = namespace_dir_ + underscore(service_name_) + ".rb";
  f_service_.open(f_service_name.c_str());

  f_service_ << rb_autogen_comment() << endl << render_require_thrift();

  if (tservice->get_extends() != nullptr) {
    if (namespaced_) {
      f_service_ << "require '" << rb_namespace_to_path_prefix(
                                       tservice->get_extends()->get_program()->get_namespace("rb"))
                 << underscore(tservice->get_extends()->get_name()) << "'" << endl;
    } else {
      f_service_ << "require '" << require_prefix_
                 << underscore(tservice->get_extends()->get_name()) << "'" << endl;
    }
  }

  f_service_ << "require '" << require_prefix_ << underscore(program_name_) << "_types'" << endl
             << endl;

  begin_namespace(f_service_, ruby_modules(tservice->get_program()));

  f_service_.indent() << "module " << capitalize(tservice->get_name()) << endl;
  f_service_.indent_up();

  // Generate the three main parts of the service (well, two for now in PHP)
  generate_service_client(tservice);
  generate_service_server(tservice);
  generate_service_helpers(tservice);

  f_service_.indent_down();
  f_service_.indent() << "end" << endl << endl;

  end_namespace(f_service_, ruby_modules(tservice->get_program()));

  // Close service file
  f_service_.close();
}